

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_42055d::ArrayType::printRight(ArrayType *this,OutputStream *S)

{
  long *plVar1;
  void *pvVar2;
  size_t N;
  StringView SVar3;
  
  if ((S->CurrentPosition == 0) || (S->Buffer[S->CurrentPosition - 1] != ']')) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ' ';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '[';
  S->CurrentPosition = S->CurrentPosition + 1;
  plVar1 = (long *)(this->Dimension).First;
  pvVar2 = (this->Dimension).Second;
  if (plVar1 == (long *)0x0 || pvVar2 == (void *)0x0) {
    if (pvVar2 == (void *)0x0 && plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x20))(plVar1,S);
      if (*(char *)((long)plVar1 + 9) != '\x01') {
        (**(code **)(*plVar1 + 0x28))(plVar1,S);
      }
    }
  }
  else {
    SVar3 = NodeOrString::asString(&this->Dimension);
    N = (long)SVar3.Last - (long)SVar3.First;
    if (N != 0) {
      OutputStream::grow(S,N);
      memmove(S->Buffer + S->CurrentPosition,SVar3.First,N);
      S->CurrentPosition = S->CurrentPosition + N;
    }
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ']';
  S->CurrentPosition = S->CurrentPosition + 1;
  (*this->Base->_vptr_Node[5])(this->Base,S);
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    if (S.back() != ']')
      S += " ";
    S += "[";
    if (Dimension.isString())
      S += Dimension.asString();
    else if (Dimension.isNode())
      Dimension.asNode()->print(S);
    S += "]";
    Base->printRight(S);
  }